

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_group_ops(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  long *plVar6;
  ulong uVar7;
  pointer ppLVar8;
  Layer *pLVar9;
  long lVar10;
  pointer ppLVar11;
  int iVar12;
  void *in_R8;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  ParamDict pd;
  undefined8 uStack_1c8;
  undefined8 auStack_1bc [2];
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_19c;
  uint local_190;
  int local_18c;
  Mat local_188;
  void *local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  int iStack_128;
  Allocator *local_120;
  uint local_118;
  undefined4 uStack_114;
  ulong uStack_110;
  uint local_108;
  long local_100;
  int local_ec;
  Mat local_e8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_98;
  long local_90;
  Allocator *local_88;
  size_t local_80;
  ulong local_78;
  ModelBinFromMatArray local_70;
  long local_60;
  Mat *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  iVar1 = (this->super_DeconvolutionDepthWise).num_output;
  iVar12 = (this->super_DeconvolutionDepthWise).kernel_h *
           (this->super_DeconvolutionDepthWise).kernel_w;
  iVar2 = (this->super_DeconvolutionDepthWise).group;
  uVar7 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)iVar12;
  ppLVar11 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar11 - (long)ppLVar8) >> 3)) {
    lVar15 = 0;
    do {
      if (ppLVar8[lVar15] != (Layer *)0x0) {
        uStack_1a0 = 0x463f4a;
        (*ppLVar8[lVar15]->_vptr_Layer[1])();
      }
      lVar15 = lVar15 + 1;
      ppLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar11 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar15 < (int)((ulong)((long)ppLVar11 - (long)ppLVar8) >> 3));
  }
  local_98 = &this->group_ops;
  if (ppLVar11 != ppLVar8) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar8;
  }
  iVar3 = (this->super_DeconvolutionDepthWise).group;
  local_190 = (this->super_DeconvolutionDepthWise).num_output / iVar3;
  uStack_1a0 = 0x463fae;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_98,(long)iVar3);
  if (0 < (this->super_DeconvolutionDepthWise).group) {
    local_ec = iVar12 * local_190 *
               (((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                      (long)(iVar1 / iVar2)) * iVar2) / iVar3);
    local_50 = (size_t)local_ec;
    local_60 = (long)(int)local_190;
    local_58 = &(this->super_DeconvolutionDepthWise).activation_params;
    lVar15 = 0;
    do {
      sVar4 = (this->super_DeconvolutionDepthWise).weight_data.elemsize;
      local_188.data =
           (void *)(lVar15 * local_50 * sVar4 +
                   (long)(this->super_DeconvolutionDepthWise).weight_data.data);
      local_188.elempack = (this->super_DeconvolutionDepthWise).weight_data.elempack;
      local_188.allocator = (this->super_DeconvolutionDepthWise).weight_data.allocator;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = (undefined4)sVar4;
      local_188.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
      local_188.dims = 1;
      local_188.w = (int)local_50;
      local_188.h = 1;
      local_188.d = 1;
      local_188.c = 1;
      local_188.cstep = local_50;
      uStack_1a0 = 0x46408c;
      Mat::clone(&local_e8,(__fn *)&local_188,(void *)0x0,1,in_R8);
      piVar5 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              uStack_1a0 = 0x4640bf;
              free(local_188.data);
            }
          }
          else {
            uStack_1a0 = 0x4640b0;
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      bVar16 = (this->super_DeconvolutionDepthWise).bias_term == 0;
      if (bVar16) {
        local_78 = 0;
        local_88 = (Allocator *)0x0;
        local_18c = 0;
        local_80 = 0;
        pvVar13 = (void *)0x0;
        local_90 = 0;
      }
      else {
        local_80 = (this->super_DeconvolutionDepthWise).bias_data.elemsize;
        pvVar13 = (void *)(lVar15 * local_60 * local_80 +
                          (long)(this->super_DeconvolutionDepthWise).bias_data.data);
        local_18c = (this->super_DeconvolutionDepthWise).bias_data.elempack;
        local_88 = (this->super_DeconvolutionDepthWise).bias_data.allocator;
        local_78 = (ulong)local_190;
        local_90 = local_60;
      }
      bVar16 = !bVar16;
      uVar14 = (uint)bVar16;
      uStack_1a0 = 0x464195;
      pLVar9 = create_layer_cpu(8);
      uStack_1a0 = 0x4641a0;
      ParamDict::ParamDict(&local_40);
      uStack_1a0 = 0x4641ae;
      ParamDict::set(&local_40,0,local_190);
      uStack_1a0 = 0x4641c2;
      ParamDict::set(&local_40,1,(this->super_DeconvolutionDepthWise).kernel_w);
      uStack_1a0 = 0x4641d6;
      ParamDict::set(&local_40,0xb,(this->super_DeconvolutionDepthWise).kernel_h);
      uStack_1a0 = 0x4641ea;
      ParamDict::set(&local_40,2,(this->super_DeconvolutionDepthWise).dilation_w);
      uStack_1a0 = 0x4641fe;
      ParamDict::set(&local_40,0xc,(this->super_DeconvolutionDepthWise).dilation_h);
      uStack_1a0 = 0x464212;
      ParamDict::set(&local_40,3,(this->super_DeconvolutionDepthWise).stride_w);
      uStack_1a0 = 0x464226;
      ParamDict::set(&local_40,0xd,(this->super_DeconvolutionDepthWise).stride_h);
      uStack_1a0 = 0x464235;
      ParamDict::set(&local_40,4,0);
      uStack_1a0 = 0x464244;
      ParamDict::set(&local_40,0xe,0);
      uStack_1a0 = 0x464258;
      ParamDict::set(&local_40,0x12,(this->super_DeconvolutionDepthWise).output_pad_right);
      uStack_1a0 = 0x46426c;
      ParamDict::set(&local_40,0x13,(this->super_DeconvolutionDepthWise).output_pad_bottom);
      uStack_1a0 = 0x464280;
      ParamDict::set(&local_40,5,(this->super_DeconvolutionDepthWise).bias_term);
      uStack_1a0 = 0x464294;
      ParamDict::set(&local_40,6,local_ec);
      uStack_1a0 = 0x4642a8;
      ParamDict::set(&local_40,9,(this->super_DeconvolutionDepthWise).activation_type);
      uStack_1a0 = 0x4642bd;
      ParamDict::set(&local_40,10,local_58);
      uStack_1a0 = 0x4642c9;
      (*pLVar9->_vptr_Layer[2])(pLVar9,&local_40);
      if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_188.data = local_e8.data;
        local_188.refcount._0_4_ = local_e8.refcount._0_4_;
        local_188.refcount._4_4_ = local_e8.refcount._4_4_;
        local_188.elemsize._0_4_ = (undefined4)local_e8.elemsize;
        local_188.elemsize._4_4_ = local_e8.elemsize._4_4_;
        local_188.elempack = local_e8.elempack;
        local_188.allocator = local_e8.allocator;
        local_188.dims = local_e8.dims;
        local_188.w = local_e8.w;
        local_188.h = local_e8.h;
        local_188.d = local_e8.d;
        local_188.c = local_e8.c;
        local_188.cstep = local_e8.cstep;
        uStack_1a0 = 0x464644;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_70,&local_188);
        uStack_1a0 = 0x464650;
        (*pLVar9->_vptr_Layer[3])(pLVar9,&local_70);
        uStack_1a0 = 0x464658;
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_70);
        piVar5 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                uStack_1a0 = 0x46468b;
                free(local_188.data);
              }
            }
            else {
              uStack_1a0 = 0x46467c;
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
      }
      else {
        lVar10 = 0x40;
        do {
          *(undefined8 *)((long)&local_188.data + lVar10) = 0;
          *(undefined8 *)((long)&uStack_1c8 + lVar10) = 0;
          *(undefined8 *)(&stack0xfffffffffffffe40 + lVar10) = 0;
          *(undefined8 *)((long)auStack_1bc + lVar10) = 0;
          *(undefined8 *)((long)auStack_1bc + lVar10 + 8) = 0;
          *(undefined8 *)((long)&uStack_1a8 + lVar10) = 0;
          *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar10) = 0;
          *(undefined8 *)((long)((long)register0x00000020 + -0x19c) + lVar10) = 0;
          *(undefined8 *)(&stack0xfffffffffffffe6c + lVar10) = 0;
          lVar10 = lVar10 + 0x48;
        } while (lVar10 != 0xd0);
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                uStack_1a0 = 0x4643ce;
                free(local_188.data);
              }
            }
            else {
              uStack_1a0 = 0x464344;
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.data = local_e8.data;
        local_188.refcount._0_4_ = local_e8.refcount._0_4_;
        local_188.refcount._4_4_ = local_e8.refcount._4_4_;
        local_188.elemsize._0_4_ = (undefined4)local_e8.elemsize;
        local_188.elemsize._4_4_ = local_e8.elemsize._4_4_;
        local_188.elempack = local_e8.elempack;
        local_188.allocator = local_e8.allocator;
        local_188.dims = local_e8.dims;
        local_188.w = local_e8.w;
        local_188.h = local_e8.h;
        local_188.d = local_e8.d;
        local_188.c = local_e8.c;
        local_188.cstep = local_e8.cstep;
        piVar5 = (int *)CONCAT44(uStack_134,uStack_138);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_120 == (Allocator *)0x0) {
              if (local_140 != (void *)0x0) {
                uStack_1a0 = 0x46447d;
                free(local_140);
              }
            }
            else {
              uStack_1a0 = 0x46446e;
              (*local_120->_vptr_Allocator[3])();
            }
          }
        }
        uStack_138 = 0;
        uStack_134 = 0;
        uStack_130 = (undefined4)local_80;
        uStack_12c = (undefined4)(local_80 >> 0x20);
        iStack_128 = local_18c;
        local_120 = local_88;
        _local_118 = CONCAT44((int)local_78,uVar14);
        uStack_110 = (ulong)CONCAT14(bVar16,uVar14);
        local_100 = local_90;
        uStack_1a0 = 0x464522;
        local_140 = pvVar13;
        local_108 = uVar14;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_70,&local_188);
        uStack_1a0 = 0x46452e;
        (*pLVar9->_vptr_Layer[3])(pLVar9,&local_70);
        uStack_1a0 = 0x464536;
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_70);
        lVar10 = 0x48;
        do {
          piVar5 = *(int **)((long)&local_188.refcount + lVar10);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              pvVar13 = *(void **)((long)&local_188.data + lVar10);
              plVar6 = *(long **)((long)&local_188.allocator + lVar10);
              if (plVar6 == (long *)0x0) {
                if (pvVar13 != (void *)0x0) {
                  uStack_1a0 = 0x46456f;
                  free(pvVar13);
                }
              }
              else {
                uStack_1a0 = 0x464560;
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_188.cstep + lVar10) = 0;
          *(undefined8 *)((long)&local_188.refcount + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_188.elemsize + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_188.data + lVar10) = 0;
          *(undefined8 *)((long)&local_188.refcount + lVar10) = 0;
          *(undefined8 *)((long)&local_188.dims + lVar10) = 0;
          *(undefined8 *)((long)&local_188.h + lVar10) = 0;
          *(undefined4 *)((long)&local_188.c + lVar10) = 0;
          lVar10 = lVar10 + -0x48;
        } while (lVar10 != -0x48);
      }
      uStack_1a0 = 0x4646c1;
      (*pLVar9->_vptr_Layer[4])(pLVar9,local_48);
      (local_98->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar15] = pLVar9;
      uStack_1a0 = 0x4646d8;
      ParamDict::~ParamDict(&local_40);
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              uStack_1a0 = 0x464714;
              free(local_e8.data);
            }
          }
          else {
            uStack_1a0 = 0x464705;
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->super_DeconvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}